

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

void __thiscall libDAI::TFactor<double>::TFactor(TFactor<double> *this,VarSet *ns,Real *p)

{
  VarSet::VarSet(&this->_vs,ns);
  TProb<double>::TProb(&this->_p,(this->_vs)._statespace,p);
  return;
}

Assistant:

TFactor( const VarSet& ns, const Real* p ) : _vs(ns), _p(_vs.stateSpace(),p) {}